

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void dump_alGetBufferfv(CallerInfo *callerinfo,ALuint name,ALenum param,ALfloat *origvalues,
                       uint32 numvals,ALfloat *values)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  uint local_34;
  uint32 i;
  ALfloat *values_local;
  uint32 numvals_local;
  ALfloat *origvalues_local;
  ALenum param_local;
  ALuint name_local;
  CallerInfo *callerinfo_local;
  
  pcVar1 = bufferString(name);
  pcVar2 = alenumString(param);
  pcVar3 = ptrString(origvalues);
  printf("(%s, %s, %s)",pcVar1,pcVar2,pcVar3);
  if (origvalues != (ALfloat *)0x0) {
    printf(" => {");
    for (local_34 = 0; local_34 < numvals; local_34 = local_34 + 1) {
      pcVar1 = "";
      if (local_34 != 0) {
        pcVar1 = ",";
      }
      printf("%s %f",(double)values[local_34],pcVar1);
    }
    pcVar1 = "";
    if (numvals != 0) {
      pcVar1 = " ";
    }
    printf("%s}",pcVar1);
  }
  printf("\n");
  return;
}

Assistant:

static void dump_alGetBufferfv(CallerInfo *callerinfo, ALuint name, ALenum param, ALfloat *origvalues, uint32 numvals, ALfloat *values)
{
    uint32 i;
    printf("(%s, %s, %s)", bufferString(name), alenumString(param), ptrString(origvalues));
    if (origvalues) {
        printf(" => {");
        for (i = 0; i < numvals; i++) {
            printf("%s %f", i > 0 ? "," : "", values[i]);
        }
        printf("%s}", numvals > 0 ? " " : "");
    }
    printf("\n");
}